

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

void uECC_vli_modInv(uECC_word_t *result,uECC_word_t *input,uECC_word_t *mod,wordcount_t num_words)

{
  cmpresult_t cVar1;
  uECC_word_t uVar2;
  cmpresult_t cmpResult;
  uECC_word_t v [4];
  uECC_word_t u [4];
  uECC_word_t b [4];
  uECC_word_t a [4];
  wordcount_t num_words_local;
  uECC_word_t *mod_local;
  uECC_word_t *input_local;
  uECC_word_t *result_local;
  
  uVar2 = uECC_vli_isZero(input,num_words);
  if (uVar2 == 0) {
    uECC_vli_set(b + 3,input,num_words);
    uECC_vli_set(u + 3,mod,num_words);
    uECC_vli_clear(v + 3,num_words);
    v[3] = 1;
    uECC_vli_clear((uECC_word_t *)&stack0xffffffffffffff58,num_words);
    while (cVar1 = uECC_vli_cmp_unsafe(b + 3,u + 3,num_words), cVar1 != '\0') {
      if ((b[3] & 1) == 0) {
        uECC_vli_rshift1(b + 3,num_words);
        vli_modInv_update(v + 3,mod,num_words);
      }
      else if ((u[3] & 1) == 0) {
        uECC_vli_rshift1(u + 3,num_words);
        vli_modInv_update((uECC_word_t *)&stack0xffffffffffffff58,mod,num_words);
      }
      else if (cVar1 < '\x01') {
        uECC_vli_sub(u + 3,u + 3,b + 3,num_words);
        uECC_vli_rshift1(u + 3,num_words);
        cVar1 = uECC_vli_cmp_unsafe((uECC_word_t *)&stack0xffffffffffffff58,v + 3,num_words);
        if (cVar1 < '\0') {
          uECC_vli_add((uECC_word_t *)&stack0xffffffffffffff58,
                       (uECC_word_t *)&stack0xffffffffffffff58,mod,num_words);
        }
        uECC_vli_sub((uECC_word_t *)&stack0xffffffffffffff58,(uECC_word_t *)&stack0xffffffffffffff58
                     ,v + 3,num_words);
        vli_modInv_update((uECC_word_t *)&stack0xffffffffffffff58,mod,num_words);
      }
      else {
        uECC_vli_sub(b + 3,b + 3,u + 3,num_words);
        uECC_vli_rshift1(b + 3,num_words);
        cVar1 = uECC_vli_cmp_unsafe(v + 3,(uECC_word_t *)&stack0xffffffffffffff58,num_words);
        if (cVar1 < '\0') {
          uECC_vli_add(v + 3,v + 3,mod,num_words);
        }
        uECC_vli_sub(v + 3,v + 3,(uECC_word_t *)&stack0xffffffffffffff58,num_words);
        vli_modInv_update(v + 3,mod,num_words);
      }
    }
    uECC_vli_set(result,v + 3,num_words);
  }
  else {
    uECC_vli_clear(result,num_words);
  }
  return;
}

Assistant:

uECC_VLI_API void uECC_vli_modInv(uECC_word_t *result,
                                  const uECC_word_t *input,
                                  const uECC_word_t *mod,
                                  wordcount_t num_words) {
    uECC_word_t a[uECC_MAX_WORDS], b[uECC_MAX_WORDS], u[uECC_MAX_WORDS], v[uECC_MAX_WORDS];
    cmpresult_t cmpResult;

    if (uECC_vli_isZero(input, num_words)) {
        uECC_vli_clear(result, num_words);
        return;
    }

    uECC_vli_set(a, input, num_words);
    uECC_vli_set(b, mod, num_words);
    uECC_vli_clear(u, num_words);
    u[0] = 1;
    uECC_vli_clear(v, num_words);
    while ((cmpResult = uECC_vli_cmp_unsafe(a, b, num_words)) != 0) {
        if (EVEN(a)) {
            uECC_vli_rshift1(a, num_words);
            vli_modInv_update(u, mod, num_words);
        } else if (EVEN(b)) {
            uECC_vli_rshift1(b, num_words);
            vli_modInv_update(v, mod, num_words);
        } else if (cmpResult > 0) {
            uECC_vli_sub(a, a, b, num_words);
            uECC_vli_rshift1(a, num_words);
            if (uECC_vli_cmp_unsafe(u, v, num_words) < 0) {
                uECC_vli_add(u, u, mod, num_words);
            }
            uECC_vli_sub(u, u, v, num_words);
            vli_modInv_update(u, mod, num_words);
        } else {
            uECC_vli_sub(b, b, a, num_words);
            uECC_vli_rshift1(b, num_words);
            if (uECC_vli_cmp_unsafe(v, u, num_words) < 0) {
                uECC_vli_add(v, v, mod, num_words);
            }
            uECC_vli_sub(v, v, u, num_words);
            vli_modInv_update(v, mod, num_words);
        }
    }
    uECC_vli_set(result, u, num_words);
}